

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall
cs_impl::runtime_cs_ext::wait_for_impl
          (runtime_cs_ext *this,size_t mill_sec,callable *func,vector *args)

{
  future_status fVar1;
  pointer p_Var2;
  _Result<cs_impl::any> *p_Var3;
  long *plVar4;
  _State_baseV2 *__tmp;
  _State_baseV2 *__tmp_1;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_c8;
  __state_type local_b8;
  __allocator_type __a2_1;
  thread local_90;
  future<cs_impl::any> future;
  uint *local_68;
  long local_60;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (pointer)operator_new(0x58);
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0023f1a0;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
  *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
  local_c8._M_alloc = &__a2;
  *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = 0;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_0023f1f0;
  local_c8._M_ptr = p_Var2;
  p_Var3 = (_Result<cs_impl::any> *)operator_new(0x20);
  std::__future_base::_Result<cs_impl::any>::_Result(p_Var3);
  *(_Result<cs_impl::any> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
  *(callable **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x38) = func;
  *(vector **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x40) = args;
  local_90._M_id._M_thread = (id)0;
  ___a2_1 = (long *)operator_new(0x20);
  *___a2_1 = (long)&PTR___State_0023f248;
  ___a2_1[1] = (long)&p_Var2->_M_impl;
  ___a2_1[2] = (long)std::__future_base::
                     _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1379:65)>_>,_cs_impl::any>
                     ::_M_run;
  ___a2_1[3] = 0;
  std::thread::_M_start_thread(&local_90,&__a2_1,0);
  if (___a2_1 != (long *)0x0) {
    (**(code **)(*___a2_1 + 8))();
  }
  std::thread::operator=
            ((thread *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20),&local_90);
  std::thread::~thread(&local_90);
  local_c8._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_c8);
  local_48 = 0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  local_c8._M_ptr =
       (pointer)local_b8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)&p_Var2->_M_impl;
  local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  if (local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    p_Var2 = (pointer)operator_new(0x48);
    local_c8._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)&__a2_1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_0023f288;
    *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
    (p_Var2->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_0023f2d8;
    local_c8._M_ptr = p_Var2;
    p_Var3 = (_Result<cs_impl::any> *)operator_new(0x20);
    std::__future_base::_Result<cs_impl::any>::_Result(p_Var3);
    *(_Result<cs_impl::any> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
    *(callable **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = func;
    *(vector **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = args;
    local_c8._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/type_ext.cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_c8);
    local_48 = 0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_b8.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_c8._M_ptr =
         (pointer)local_b8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var2->_M_impl;
    local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  std::__basic_future<cs_impl::any>::__basic_future
            (&future.super___basic_future<cs_impl::any>,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_c8._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_instance_type_ext_cpp:1379:65)>_>,_cs_impl::any>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)mill_sec;
  fVar1 = std::__basic_future<cs_impl::any>::wait_for<long,std::ratio<1l,1000l>>
                    (&future.super___basic_future<cs_impl::any>,
                     (duration<long,_std::ratio<1L,_1000L>_> *)&local_c8);
  if (fVar1 == ready) {
    std::future<cs_impl::any>::get((future<cs_impl::any> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&future.super___basic_future<cs_impl::any>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (var)(proxy *)this;
  }
  plVar4 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            ((string *)&local_68,"Target function deferred or timeout.",(allocator *)&local_c8);
  *plVar4 = (long)(plVar4 + 2);
  if (local_68 == &local_58) {
    *(uint *)(plVar4 + 2) = local_58;
    *(undefined4 *)((long)plVar4 + 0x14) = uStack_54;
    *(undefined4 *)(plVar4 + 3) = uStack_50;
    *(undefined4 *)((long)plVar4 + 0x1c) = uStack_4c;
  }
  else {
    *plVar4 = (long)local_68;
    plVar4[2] = CONCAT44(uStack_54,local_58);
  }
  plVar4[1] = local_60;
  local_60 = 0;
  local_58 = local_58 & 0xffffff00;
  local_68 = &local_58;
  __cxa_throw(plVar4,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

cs::var wait_for_impl(std::size_t mill_sec, const cs::callable &func, cs::vector &args)
		{
			std::future<cs::var> future = std::async(std::launch::async, [&func, &args]() -> var {
				return wait_worker(func, args);
			});
			if (future.wait_for(std::chrono::milliseconds(mill_sec)) != std::future_status::ready)
				throw cs::lang_error("Target function deferred or timeout.");
			else
				return future.get();
		}